

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Connection::Table
          (Connection *this,string *catalog_name,string *schema_name,string *table_name)

{
  undefined1 __p [8];
  _Alloc_hider __p_00;
  size_type sVar1;
  CatalogException *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_R8;
  shared_ptr<duckdb::Relation,_true> sVar2;
  allocator local_91;
  unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
  table_info;
  undefined1 local_80 [8];
  string local_78;
  string local_50;
  
  table_info.
  super_unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::TableDescription_*,_std::default_delete<duckdb::TableDescription>_>
  .super__Head_base<0UL,_duckdb::TableDescription_*,_false>._M_head_impl =
       (unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>)
       (__uniq_ptr_data<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true,_true>
        )0x0;
  TableInfo((Connection *)(local_80 + 8),catalog_name,schema_name,table_name);
  __p_00._M_p = local_78._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>::
  reset((__uniq_ptr_impl<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_> *
        )&table_info,(pointer)__p_00._M_p);
  ::std::unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>::
  ~unique_ptr((unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>
               *)(local_80 + 8));
  if (table_info.
      super_unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::TableDescription_*,_std::default_delete<duckdb::TableDescription>_>
      .super__Head_base<0UL,_duckdb::TableDescription_*,_false>._M_head_impl ==
      (__uniq_ptr_data<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true,_true>
       )0x0) {
    if ((schema_name->_M_string_length == 0) && (table_name->_M_string_length != 0)) {
      ::std::__cxx11::string::string((string *)(local_80 + 8),"main",&local_91);
      TableInfo((Connection *)local_80,catalog_name,table_name,(string *)(local_80 + 8));
      __p = local_80;
      local_80 = (undefined1  [8])0x0;
      ::std::
      __uniq_ptr_impl<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>::
      reset((__uniq_ptr_impl<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>
             *)&table_info,(pointer)__p);
      ::std::unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>::
      ~unique_ptr((unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>
                   *)local_80);
      ::std::__cxx11::string::~string((string *)(local_80 + 8));
      if (table_info.
          super_unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::TableDescription_*,_std::default_delete<duckdb::TableDescription>_>
          .super__Head_base<0UL,_duckdb::TableDescription_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true,_true>
           )0x0) goto LAB_0146a057;
    }
    this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)(local_80 + 8),"Table %s does not exist!",(allocator *)local_80);
    ParseInfo::QualifierToString(&local_50,schema_name,table_name,in_R8);
    CatalogException::CatalogException<std::__cxx11::string>
              (this_00,(string *)(local_80 + 8),&local_50);
    __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
  }
LAB_0146a057:
  make_shared_ptr<duckdb::TableRelation,duckdb::shared_ptr<duckdb::ClientContext,true>&,duckdb::unique_ptr<duckdb::TableDescription,std::default_delete<duckdb::TableDescription>,true>>
            ((shared_ptr<duckdb::ClientContext,_true> *)(local_80 + 8),
             (unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
              *)catalog_name);
  sVar1 = local_78._M_string_length;
  local_78._M_string_length = 0;
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_78._M_dataplus._M_p;
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1;
  local_78._M_dataplus._M_p = (pointer)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length);
  ::std::unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>::
  ~unique_ptr(&table_info.
               super_unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>
             );
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Connection::Table(const string &catalog_name, const string &schema_name,
                                       const string &table_name) {
	unique_ptr<TableDescription> table_info;
	do {
		table_info = TableInfo(catalog_name, schema_name, table_name);
		if (table_info) {
			break;
		}

		if (catalog_name.empty() && !schema_name.empty()) {
			table_info = TableInfo(schema_name, DEFAULT_SCHEMA, table_name);
		}
	} while (false);

	if (!table_info) {
		throw CatalogException("Table %s does not exist!",
		                       ParseInfo::QualifierToString(catalog_name, schema_name, table_name));
	}
	return make_shared_ptr<TableRelation>(context, std::move(table_info));
}